

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

int * parasail_result_get_score_table(parasail_result_t *result)

{
  parasail_result_extra_rowcols_t *ppVar1;
  
  if (result == (parasail_result_t *)0x0) {
    parasail_result_get_score_table_cold_2();
  }
  else {
    if (((result->flag & 0x20000) != 0) || ((~result->flag & 0x30000U) == 0)) {
      if ((~result->flag & 0x30000U) == 0) {
        ppVar1 = (parasail_result_extra_rowcols_t *)((result->field_4).trace)->trace_del_table;
      }
      else {
        if ((result->flag & 0x20000) == 0) {
          return (int *)0x0;
        }
        ppVar1 = (result->field_4).rowcols;
      }
      return ppVar1->score_row;
    }
    parasail_result_get_score_table_cold_1();
  }
  return (int *)0x0;
}

Assistant:

int* parasail_result_get_score_table(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_table(result) || parasail_result_is_stats_table(result));
    if (parasail_result_is_stats_table(result)) {
        return result->stats->tables->score_table;
    }
    if (parasail_result_is_table(result)) {
        return result->tables->score_table;
    }
    return NULL; /* should not reach */
}